

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createVectorExtractDynamic(Builder *this,Id vector,Id typeId,Id componentIndex)

{
  Block *this_00;
  Id IVar1;
  Instruction *this_01;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40 [3];
  Instruction *local_28;
  Instruction *extract;
  Id local_18;
  Id componentIndex_local;
  Id typeId_local;
  Id vector_local;
  Builder *this_local;
  
  extract._4_4_ = componentIndex;
  local_18 = typeId;
  componentIndex_local = vector;
  _typeId_local = this;
  this_01 = (Instruction *)
            Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,vector));
  IVar1 = getUniqueId(this);
  Instruction::Instruction(this_01,IVar1,local_18,OpVectorExtractDynamic);
  local_28 = this_01;
  Instruction::addIdOperand(this_01,componentIndex_local);
  Instruction::addIdOperand(local_28,extract._4_4_);
  this_00 = this->buildPoint;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_40,local_28
            );
  Block::addInstruction(this_00,local_40);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_40);
  IVar1 = Instruction::getResultId(local_28);
  return IVar1;
}

Assistant:

Id Builder::createVectorExtractDynamic(Id vector, Id typeId, Id componentIndex)
{
    Instruction* extract = new Instruction(getUniqueId(), typeId, OpVectorExtractDynamic);
    extract->addIdOperand(vector);
    extract->addIdOperand(componentIndex);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(extract));

    return extract->getResultId();
}